

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Partial_Test::
~EncodeDecodeTest_Partial_Test(EncodeDecodeTest_Partial_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_EncodeDecodeTest).
  super_TestWithParam<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  super_Test._vptr_Test = (_func_int **)&PTR__EncodeDecodeTest_0192ca18;
  (this->super_EncodeDecodeTest).
  super_TestWithParam<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  super_WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>.
  _vptr_WithParamInterface = (_func_int **)&PTR__EncodeDecodeTest_0192ca58;
  pcVar2 = (this->super_EncodeDecodeTest).unittest_proto_descriptor_set_filename_._M_dataplus._M_p;
  paVar1 = &(this->super_EncodeDecodeTest).unittest_proto_descriptor_set_filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_EncodeDecodeTest).captured_errors_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_EncodeDecodeTest).captured_warnings_);
  pcVar2 = (this->super_EncodeDecodeTest).captured_stderr_._M_dataplus._M_p;
  paVar1 = &(this->super_EncodeDecodeTest).captured_stderr_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_EncodeDecodeTest).captured_stdout_._M_dataplus._M_p;
  paVar1 = &(this->super_EncodeDecodeTest).captured_stdout_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Partial) {
  RedirectStdinFromText("");
  EXPECT_TRUE(
      Run("google/protobuf/unittest.proto"
          " --encode=proto2_unittest.TestRequired"));
  ExpectStdoutMatchesText("");
  ExpectWarning("warning:  Input message is missing required fields:  a, b, c");
}